

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warped_motion.c
# Opt level: O0

void av1_highbd_warp_affine_c
               (int32_t *mat,uint16_t *ref,int width,int height,int stride,uint16_t *pred,int p_col,
               int p_row,int p_width,int p_height,int p_stride,int subsampling_x,int subsampling_y,
               int bd,ConvolveParams *conv_params,int16_t alpha,int16_t beta,int16_t gamma,
               int16_t delta)

{
  byte bVar1;
  uint16_t uVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  uint16_t *puVar7;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  int *in_RDI;
  int in_R8D;
  long in_R9;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  uint16_t *p_1;
  int in_stack_00000028;
  int32_t tmp32;
  uint16_t *dst16;
  CONV_BUF_TYPE *p;
  int m_1;
  int32_t sum_1;
  WarpedFilterCoeff *coeffs_1;
  short in_stack_00000050;
  int offs_1;
  int l_1;
  int sy;
  int k_1;
  int sample_x;
  int m;
  int32_t sum;
  WarpedFilterCoeff *coeffs;
  int offs;
  int ix;
  int l;
  int sx;
  int iy;
  int k;
  int32_t sy4;
  int32_t iy4;
  int32_t sx4;
  int32_t ix4;
  int64_t y4;
  int64_t x4;
  int64_t dst_y;
  int64_t dst_x;
  int32_t src_y;
  int32_t src_x;
  int j;
  int i;
  int offset_bits;
  int round_bits;
  int offset_bits_vert;
  int offset_bits_horiz;
  int max_bits_horiz;
  int reduce_bits_vert;
  int reduce_bits_horiz;
  int32_t tmp [120];
  int in_stack_fffffffffffffd0c;
  int in_stack_fffffffffffffd10;
  int local_2ec;
  int local_2e4;
  byte local_2dc;
  int local_2b8;
  int local_2b4;
  int local_2a0;
  int local_29c;
  int local_298;
  int local_290;
  int local_28c;
  int local_278;
  int local_274;
  int local_26c;
  int local_22c;
  int local_228;
  int aiStack_208 [120];
  long local_28;
  int local_1c;
  int local_18;
  int local_14;
  long local_10;
  int *local_8;
  
  bVar1 = (byte)*(undefined4 *)(coeffs_1 + 10);
  if (*(int *)(coeffs_1 + 0x10) == 0) {
    local_2dc = 0xe - bVar1;
  }
  else {
    local_2dc = (byte)*(undefined4 *)(coeffs_1 + 0xc);
  }
  local_28 = in_R9;
  local_1c = in_R8D;
  local_18 = in_ECX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_228 = in_stack_00000010; local_228 < in_stack_00000010 + (int)p_1;
      local_228 = local_228 + 8) {
    for (local_22c = in_stack_00000008; local_22c < in_stack_00000008 + in_stack_00000018;
        local_22c = local_22c + 8) {
      iVar3 = local_22c + 4 << ((byte)dst16 & 0x1f);
      iVar4 = local_228 + 4 << ((byte)p & 0x1f);
      lVar5 = (long)local_8[2] * (long)iVar3 + (long)local_8[3] * (long)iVar4 + (long)*local_8 >>
              ((byte)dst16 & 0x3f);
      lVar6 = (long)local_8[4] * (long)iVar3 + (long)local_8[5] * (long)iVar4 + (long)local_8[1] >>
              ((byte)p & 0x3f);
      for (local_26c = -7; local_26c < 8; local_26c = local_26c + 1) {
        iVar3 = clamp((int)((ulong)lVar6 >> 0x10) + local_26c,0,local_18 + -1);
        local_274 = (in_stack_00000050 * -4 + (short)l_1 * -4 + ((uint)lVar5 & 0xffff) & 0xffffffc0)
                    + (int)(short)l_1 * (local_26c + 4);
        for (local_278 = -4; local_278 < 4; local_278 = local_278 + 1) {
          local_28c = 1 << ((char)m_1 + 6U & 0x1f);
          for (local_290 = 0; local_290 < 8; local_290 = local_290 + 1) {
            iVar4 = clamp((int)((ulong)lVar5 >> 0x10) + local_278 + -3 + local_290,0,local_14 + -1);
            local_28c = (uint)*(ushort *)(local_10 + (long)(iVar3 * local_1c + iVar4) * 2) *
                        (int)av1_warped_filter[(local_274 + 0x200 >> 10) + 0x40][local_290] +
                        local_28c;
          }
          aiStack_208[(local_26c + 7) * 8 + local_278 + 4] =
               local_28c + ((1 << (bVar1 & 0x1f)) >> 1) >> (bVar1 & 0x1f);
          local_274 = in_stack_00000050 + local_274;
        }
      }
      local_298 = -4;
      while( true ) {
        if (((in_stack_00000010 + (int)p_1) - local_228) + -4 < 5) {
          local_2e4 = ((in_stack_00000010 + (int)p_1) - local_228) + -4;
        }
        else {
          local_2e4 = 4;
        }
        if (local_2e4 <= local_298) break;
        local_29c = ((short)k_1 * -4 + (short)m * -4 + ((uint)lVar6 & 0xffff) & 0xffffffc0) +
                    (int)(short)m * (local_298 + 4);
        local_2a0 = -4;
        while( true ) {
          if (((in_stack_00000008 + in_stack_00000018) - local_22c) + -4 < 5) {
            local_2ec = ((in_stack_00000008 + in_stack_00000018) - local_22c) + -4;
          }
          else {
            local_2ec = 4;
          }
          if (local_2ec <= local_2a0) break;
          local_2b4 = 1 << (((char)m_1 + '\x0e') - bVar1 & 0x1f);
          for (local_2b8 = 0; local_2b8 < 8; local_2b8 = local_2b8 + 1) {
            local_2b4 = aiStack_208[(local_298 + local_2b8 + 4) * 8 + local_2a0 + 4] *
                        (int)av1_warped_filter[(local_29c + 0x200 >> 10) + 0x40][local_2b8] +
                        local_2b4;
          }
          if (*(int *)(coeffs_1 + 0x10) == 0) {
            puVar7 = (uint16_t *)
                     (local_28 +
                     (long)(((local_228 - in_stack_00000010) + local_298 + 4) * in_stack_00000028 +
                           (local_22c - in_stack_00000008) + local_2a0 + 4) * 2);
            uVar2 = clip_pixel_highbd(in_stack_fffffffffffffd10,in_stack_fffffffffffffd0c);
            *puVar7 = uVar2;
          }
          else if (*(int *)coeffs_1 == 0) {
            *(short *)(*(long *)(coeffs_1 + 4) +
                      (long)(((local_228 - in_stack_00000010) + local_298 + 4) *
                             *(int *)(coeffs_1 + 8) +
                            (local_22c - in_stack_00000008) + local_2a0 + 4) * 2) =
                 (short)(local_2b4 + ((1 << (local_2dc & 0x1f)) >> 1) >> (local_2dc & 0x1f));
          }
          else {
            puVar7 = (uint16_t *)
                     (local_28 +
                     (long)(((local_228 - in_stack_00000010) + local_298 + 4) * in_stack_00000028 +
                           (local_22c - in_stack_00000008) + local_2a0 + 4) * 2);
            uVar2 = clip_pixel_highbd(in_stack_fffffffffffffd10,in_stack_fffffffffffffd0c);
            *puVar7 = uVar2;
          }
          local_29c = (short)k_1 + local_29c;
          local_2a0 = local_2a0 + 1;
        }
        local_298 = local_298 + 1;
      }
    }
  }
  return;
}

Assistant:

void av1_highbd_warp_affine_c(const int32_t *mat, const uint16_t *ref,
                              int width, int height, int stride, uint16_t *pred,
                              int p_col, int p_row, int p_width, int p_height,
                              int p_stride, int subsampling_x,
                              int subsampling_y, int bd,
                              ConvolveParams *conv_params, int16_t alpha,
                              int16_t beta, int16_t gamma, int16_t delta) {
  int32_t tmp[15 * 8];
  const int reduce_bits_horiz = conv_params->round_0;
  const int reduce_bits_vert = conv_params->is_compound
                                   ? conv_params->round_1
                                   : 2 * FILTER_BITS - reduce_bits_horiz;
  const int max_bits_horiz = bd + FILTER_BITS + 1 - reduce_bits_horiz;
  const int offset_bits_horiz = bd + FILTER_BITS - 1;
  const int offset_bits_vert = bd + 2 * FILTER_BITS - reduce_bits_horiz;
  const int round_bits =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const int offset_bits = bd + 2 * FILTER_BITS - conv_params->round_0;
  (void)max_bits_horiz;
  assert(IMPLIES(conv_params->is_compound, conv_params->dst != NULL));

  // Check that, even with 12-bit input, the intermediate values will fit
  // into an unsigned 16-bit intermediate array.
  assert(bd + FILTER_BITS + 2 - conv_params->round_0 <= 16);

  for (int i = p_row; i < p_row + p_height; i += 8) {
    for (int j = p_col; j < p_col + p_width; j += 8) {
      // Calculate the center of this 8x8 block,
      // project to luma coordinates (if in a subsampled chroma plane),
      // apply the affine transformation,
      // then convert back to the original coordinates (if necessary)
      const int32_t src_x = (j + 4) << subsampling_x;
      const int32_t src_y = (i + 4) << subsampling_y;
      const int64_t dst_x =
          (int64_t)mat[2] * src_x + (int64_t)mat[3] * src_y + (int64_t)mat[0];
      const int64_t dst_y =
          (int64_t)mat[4] * src_x + (int64_t)mat[5] * src_y + (int64_t)mat[1];
      const int64_t x4 = dst_x >> subsampling_x;
      const int64_t y4 = dst_y >> subsampling_y;

      const int32_t ix4 = (int32_t)(x4 >> WARPEDMODEL_PREC_BITS);
      int32_t sx4 = x4 & ((1 << WARPEDMODEL_PREC_BITS) - 1);
      const int32_t iy4 = (int32_t)(y4 >> WARPEDMODEL_PREC_BITS);
      int32_t sy4 = y4 & ((1 << WARPEDMODEL_PREC_BITS) - 1);

      sx4 += alpha * (-4) + beta * (-4);
      sy4 += gamma * (-4) + delta * (-4);

      sx4 &= ~((1 << WARP_PARAM_REDUCE_BITS) - 1);
      sy4 &= ~((1 << WARP_PARAM_REDUCE_BITS) - 1);

      // Horizontal filter
      for (int k = -7; k < 8; ++k) {
        const int iy = clamp(iy4 + k, 0, height - 1);

        int sx = sx4 + beta * (k + 4);
        for (int l = -4; l < 4; ++l) {
          int ix = ix4 + l - 3;
          const int offs = ROUND_POWER_OF_TWO(sx, WARPEDDIFF_PREC_BITS) +
                           WARPEDPIXEL_PREC_SHIFTS;
          assert(offs >= 0 && offs <= WARPEDPIXEL_PREC_SHIFTS * 3);
          const WarpedFilterCoeff *coeffs = av1_warped_filter[offs];

          int32_t sum = 1 << offset_bits_horiz;
          for (int m = 0; m < 8; ++m) {
            const int sample_x = clamp(ix + m, 0, width - 1);
            sum += ref[iy * stride + sample_x] * coeffs[m];
          }
          sum = ROUND_POWER_OF_TWO(sum, reduce_bits_horiz);
          assert(0 <= sum && sum < (1 << max_bits_horiz));
          tmp[(k + 7) * 8 + (l + 4)] = sum;
          sx += alpha;
        }
      }

      // Vertical filter
      for (int k = -4; k < AOMMIN(4, p_row + p_height - i - 4); ++k) {
        int sy = sy4 + delta * (k + 4);
        for (int l = -4; l < AOMMIN(4, p_col + p_width - j - 4); ++l) {
          const int offs = ROUND_POWER_OF_TWO(sy, WARPEDDIFF_PREC_BITS) +
                           WARPEDPIXEL_PREC_SHIFTS;
          assert(offs >= 0 && offs <= WARPEDPIXEL_PREC_SHIFTS * 3);
          const WarpedFilterCoeff *coeffs = av1_warped_filter[offs];

          int32_t sum = 1 << offset_bits_vert;
          for (int m = 0; m < 8; ++m) {
            sum += tmp[(k + m + 4) * 8 + (l + 4)] * coeffs[m];
          }

          if (conv_params->is_compound) {
            CONV_BUF_TYPE *p =
                &conv_params
                     ->dst[(i - p_row + k + 4) * conv_params->dst_stride +
                           (j - p_col + l + 4)];
            sum = ROUND_POWER_OF_TWO(sum, reduce_bits_vert);
            if (conv_params->do_average) {
              uint16_t *dst16 =
                  &pred[(i - p_row + k + 4) * p_stride + (j - p_col + l + 4)];
              int32_t tmp32 = *p;
              if (conv_params->use_dist_wtd_comp_avg) {
                tmp32 = tmp32 * conv_params->fwd_offset +
                        sum * conv_params->bck_offset;
                tmp32 = tmp32 >> DIST_PRECISION_BITS;
              } else {
                tmp32 += sum;
                tmp32 = tmp32 >> 1;
              }
              tmp32 = tmp32 - (1 << (offset_bits - conv_params->round_1)) -
                      (1 << (offset_bits - conv_params->round_1 - 1));
              *dst16 =
                  clip_pixel_highbd(ROUND_POWER_OF_TWO(tmp32, round_bits), bd);
            } else {
              *p = sum;
            }
          } else {
            uint16_t *p =
                &pred[(i - p_row + k + 4) * p_stride + (j - p_col + l + 4)];
            sum = ROUND_POWER_OF_TWO(sum, reduce_bits_vert);
            assert(0 <= sum && sum < (1 << (bd + 2)));
            *p = clip_pixel_highbd(sum - (1 << (bd - 1)) - (1 << bd), bd);
          }
          sy += gamma;
        }
      }
    }
  }
}